

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<7,451>::print<std::back_insert_iterator<std::__cxx11::string>>
          (Type<7,451> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF)

{
  ListRecord *pLVar1;
  ElementInformation *entry;
  ListRecord *this_00;
  StructureDivision local_68;
  
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = (double)*(int *)this;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = *(double *)(this + 8);
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (*(long *)(this + 0x18) - *(long *)(this + 0x10)) / 0x48 & 0xffffffff;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  ControlRecord::print<std::back_insert_iterator<std::__cxx11::string>>
            ((ControlRecord *)&local_68,it,MAT,MF,0x1c3);
  pLVar1 = *(ListRecord **)(this + 0x18);
  for (this_00 = *(ListRecord **)(this + 0x10); this_00 != pLVar1; this_00 = this_00 + 1) {
    ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,0x1c3);
  }
  sectionEndRecord(&local_68,MAT,MF);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_68,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF ) const {

  int MT = this->MT();
  ControlRecord( this->ZA(), this->AWR(),
                 this->NA(), 0,
                 0, 0 ).print( it, MAT, MF, MT );
  for ( const auto& entry : this->elements_ ) {

    entry.print( it, MAT, MF, MT );
  }
  SEND( MAT, MF ).print( it );
}